

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_clean_url(char *inURL,char *outURL,int *status)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  grp_stack_data __s;
  size_t sVar5;
  size_t string_size;
  char *saveptr;
  char *tmp;
  grp_stack *mystack;
  int *status_local;
  char *outURL_local;
  char *inURL_local;
  
  if (*status != 0) {
    return *status;
  }
  mystack = (grp_stack *)status;
  status_local = (int *)outURL;
  outURL_local = inURL;
  tmp = (char *)new_grp_stack();
  *(undefined1 *)status_local = 0;
  pcVar3 = strstr(outURL_local,"://");
  if (pcVar3 != (char *)0x0) {
    pcVar3 = strchr(pcVar3 + 3,0x2f);
    if (pcVar3 == (char *)0x0) {
      strcpy((char *)status_local,outURL_local);
      goto LAB_00214c82;
    }
    sVar4 = (long)pcVar3 - (long)outURL_local;
    strncpy((char *)status_local,outURL_local,sVar4);
    *(undefined1 *)((long)status_local + sVar4) = 0;
    outURL_local = pcVar3;
  }
  if (*outURL_local == '/') {
    strcat((char *)status_local,"/");
  }
  saveptr = strtok(outURL_local,"/");
  while (saveptr != (char *)0x0) {
    iVar2 = strcmp(saveptr,"..");
    if (iVar2 == 0) {
      if (*(long *)tmp == 0) {
        if (*outURL_local != '/') {
          push_grp_stack((grp_stack *)tmp,saveptr);
        }
      }
      else {
        pop_grp_stack((grp_stack *)tmp);
      }
    }
    else {
      iVar2 = strcmp(saveptr,".");
      if (iVar2 != 0) {
        push_grp_stack((grp_stack *)tmp,saveptr);
      }
    }
    saveptr = strtok((char *)0x0,"/");
  }
  while (piVar1 = status_local, *(long *)tmp != 0) {
    __s = shift_grp_stack((grp_stack *)tmp);
    sVar4 = strlen((char *)status_local);
    sVar5 = strlen(__s);
    if (0x400 < sVar4 + sVar5 + 1) {
      *(undefined1 *)status_local = 0;
      ffpmsg("outURL is too long (fits_clean_url)");
      *(undefined4 *)&mystack->stack_size = 0x7d;
      delete_grp_stack((grp_stack **)&tmp);
      return (int)mystack->stack_size;
    }
    strcat((char *)status_local,__s);
    strcat((char *)status_local,"/");
  }
  sVar4 = strlen((char *)status_local);
  *(undefined1 *)((long)piVar1 + (sVar4 - 1)) = 0;
LAB_00214c82:
  delete_grp_stack((grp_stack **)&tmp);
  return (int)mystack->stack_size;
}

Assistant:

int fits_clean_url(char *inURL,  /* I input URL string                      */
		   char *outURL, /* O output URL string                     */
		   int  *status)
/*
  clean the URL by eliminating any ".." or "." specifiers in the inURL
  string, and write the output to the outURL string.

  Note that this function must have a valid Unix-style URL as input; platform
  dependent path strings are not allowed.
 */
{
  grp_stack* mystack; /* stack to hold pieces of URL */
  char* tmp;
  char *saveptr;

  if(*status) return *status;

  mystack = new_grp_stack();
  *outURL = 0;

  do {
    /* handle URL scheme and domain if they exist */
    tmp = strstr(inURL, "://");
    if(tmp) {
      /* there is a URL scheme, so look for the end of the domain too */
      tmp = strchr(tmp + 3, '/');
      if(tmp) {
        /* tmp is now the end of the domain, so
         * copy URL scheme and domain as is, and terminate by hand */
        size_t string_size = (size_t) (tmp - inURL);
        strncpy(outURL, inURL, string_size);
        outURL[string_size] = 0;

        /* now advance the input pointer to just after the domain and go on */
        inURL = tmp;
      } else {
        /* '/' was not found, which means there are no path-like
         * portions, so copy whole inURL to outURL and we're done */
        strcpy(outURL, inURL);
        continue; /* while(0) */
      }
    }

    /* explicitly copy a leading / (absolute path) */
    if('/' == *inURL) strcat(outURL, "/");

    /* now clean the remainder of the inURL. push URL segments onto
     * stack, dealing with .. and . as we go */
    tmp = ffstrtok(inURL, "/",&saveptr); /* finds first / */
    while(tmp) {
      if(!strcmp(tmp, "..")) {
        /* discard previous URL segment, if there was one. if not,
         * add the .. to the stack if this is *not* an absolute path
         * (for absolute paths, leading .. has no effect, so skip it) */
        if(0 < mystack->stack_size) pop_grp_stack(mystack);
        else if('/' != *inURL) push_grp_stack(mystack, tmp);
      } else {
        /* always just skip ., but otherwise add segment to stack */
        if(strcmp(tmp, ".")) push_grp_stack(mystack, tmp);
      }
      tmp = ffstrtok(NULL, "/",&saveptr); /* get the next segment */
    }

    /* stack now has pieces of cleaned URL, so just catenate them
     * onto output string until stack is empty */
    while(0 < mystack->stack_size) {
      tmp = shift_grp_stack(mystack);
      if (strlen(outURL) + strlen(tmp) + 1 > FLEN_FILENAME-1)
      {
         outURL[0]=0;
         ffpmsg("outURL is too long (fits_clean_url)");
         *status = URL_PARSE_ERROR;
         delete_grp_stack(&mystack);
         return *status;         
      }
      strcat(outURL, tmp);
      strcat(outURL, "/");
    }
    outURL[strlen(outURL) - 1] = 0; /* blank out trailing / */
  } while(0);
  delete_grp_stack(&mystack);
  return *status;
}